

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType heapType,BinaryenIndex index)

{
  bool bVar1;
  Struct *this;
  ulong uVar2;
  size_type sVar3;
  const_reference this_00;
  TypeID TVar4;
  FieldList *fields;
  HeapType ht;
  BinaryenIndex index_local;
  BinaryenHeapType heapType_local;
  
  ht.id._4_4_ = index;
  wasm::HeapType::HeapType((HeapType *)&fields,heapType);
  bVar1 = wasm::HeapType::isStruct((HeapType *)&fields);
  if (!bVar1) {
    __assert_fail("ht.isStruct()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                  ,0x15b,
                  "BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType, BinaryenIndex)");
  }
  this = wasm::HeapType::getStruct((HeapType *)&fields);
  uVar2 = (ulong)ht.id._4_4_;
  sVar3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this->fields);
  if (uVar2 < sVar3) {
    this_00 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                        (&this->fields,(ulong)ht.id._4_4_);
    TVar4 = wasm::Type::getID(&this_00->type);
    return TVar4;
  }
  __assert_fail("index < fields.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/binaryen-c.cpp"
                ,0x15d,
                "BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType, BinaryenIndex)");
}

Assistant:

BinaryenType BinaryenStructTypeGetFieldType(BinaryenHeapType heapType,
                                            BinaryenIndex index) {
  auto ht = HeapType(heapType);
  assert(ht.isStruct());
  auto& fields = ht.getStruct().fields;
  assert(index < fields.size());
  return fields[index].type.getID();
}